

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  uint uVar1;
  Phi *pPVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  CompilerGLSL *this_00;
  uint32_t uVar5;
  __node_base_ptr p_Var6;
  TemporaryCopy TVar7;
  __hash_code __code;
  ulong uVar8;
  size_t sVar9;
  __node_base_ptr p_Var10;
  _Hash_node_base *p_Var11;
  size_t sVar12;
  Instruction *op;
  Instruction *instruction;
  long lVar13;
  EmbeddedInstruction inst;
  undefined8 local_90;
  undefined4 local_88;
  SmallVector<unsigned_int,_8UL> local_80;
  CompilerGLSL *local_48;
  size_t local_40;
  SPIRBlock *local_38;
  
  this->current_emitting_block = block;
  local_48 = this;
  if (((this->backend).requires_relaxed_precision_analysis == true) &&
     (sVar9 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size,
     sVar9 != 0)) {
    sVar12 = 0;
    local_40 = sVar9;
    local_38 = block;
    do {
      pPVar2 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
      if ((sVar12 == 0) ||
         (pPVar2[sVar12 - 1].function_variable.id != pPVar2[sVar12].function_variable.id)) {
        uVar1 = pPVar2[sVar12].function_variable.id;
        uVar3 = (local_48->temporary_to_mirror_precision_alias)._M_h._M_bucket_count;
        uVar8 = (ulong)uVar1 % uVar3;
        p_Var4 = (local_48->temporary_to_mirror_precision_alias)._M_h._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var4 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var4, p_Var10 = p_Var4->_M_nxt, uVar1 != *(uint *)&p_Var4->_M_nxt[1]._M_nxt))
        {
          while (p_Var11 = p_Var10->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var11[1]._M_nxt % uVar3 != uVar8) ||
               (p_Var6 = p_Var10, p_Var10 = p_Var11, uVar1 == *(uint *)&p_Var11[1]._M_nxt))
            goto LAB_002f3f2e;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_002f3f2e:
        if (p_Var6 == (__node_base_ptr)0x0) {
          p_Var11 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var11 = p_Var6->_M_nxt;
        }
        if (p_Var11 != (_Hash_node_base *)0x0) {
          local_80.super_VectorView<unsigned_int>.buffer_size = 0;
          local_80.buffer_capacity = 8;
          local_90 = 0x53;
          local_88 = 3;
          local_80.super_VectorView<unsigned_int>.ptr = (uint *)&local_80.stack_storage;
          uVar5 = Compiler::expression_type_id
                            (&this->super_Compiler,*(uint32_t *)&p_Var11[1]._M_nxt);
          SmallVector<unsigned_int,_8UL>::reserve
                    (&local_80,local_80.super_VectorView<unsigned_int>.buffer_size + 1);
          *(uint32_t *)
           ((char *)local_80.super_VectorView<unsigned_int>.ptr +
           local_80.super_VectorView<unsigned_int>.buffer_size * 4) = uVar5;
          sVar9 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
          local_80.super_VectorView<unsigned_int>.buffer_size =
               local_80.super_VectorView<unsigned_int>.buffer_size + 1;
          SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar9);
          *(undefined4 *)
           ((char *)local_80.super_VectorView<unsigned_int>.ptr +
           local_80.super_VectorView<unsigned_int>.buffer_size * 4) =
               *(undefined4 *)((long)&p_Var11[1]._M_nxt + 4);
          sVar9 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
          local_80.super_VectorView<unsigned_int>.buffer_size =
               local_80.super_VectorView<unsigned_int>.buffer_size + 1;
          SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar9);
          *(undefined4 *)
           ((char *)local_80.super_VectorView<unsigned_int>.ptr +
           local_80.super_VectorView<unsigned_int>.buffer_size * 4) =
               *(undefined4 *)&p_Var11[1]._M_nxt;
          local_80.super_VectorView<unsigned_int>.buffer_size =
               local_80.super_VectorView<unsigned_int>.buffer_size + 1;
          (*(this->super_Compiler)._vptr_Compiler[8])(this,&local_90);
          local_80.super_VectorView<unsigned_int>.buffer_size = 0;
          block = local_38;
          sVar9 = local_40;
          if ((AlignedBuffer<unsigned_int,_8UL> *)local_80.super_VectorView<unsigned_int>.ptr !=
              &local_80.stack_storage) {
            free(local_80.super_VectorView<unsigned_int>.ptr);
            block = local_38;
            sVar9 = local_40;
          }
        }
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != sVar9);
  }
  this_00 = local_48;
  sVar9 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  if (sVar9 != 0) {
    instruction = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
    lVar13 = sVar9 * 0xc;
    do {
      TVar7 = handle_instruction_precision(this_00,instruction);
      (*(this_00->super_Compiler)._vptr_Compiler[8])(this_00,instruction);
      if (TVar7.dst_id != 0) {
        local_80.super_VectorView<unsigned_int>.buffer_size = 0;
        local_80.buffer_capacity = 8;
        local_90 = 0x53;
        local_88 = 3;
        local_80.super_VectorView<unsigned_int>.ptr = (uint *)&local_80.stack_storage;
        uVar5 = Compiler::expression_type_id(&this_00->super_Compiler,TVar7.src_id);
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_80,local_80.super_VectorView<unsigned_int>.buffer_size + 1);
        *(uint32_t *)
         ((char *)local_80.super_VectorView<unsigned_int>.ptr +
         local_80.super_VectorView<unsigned_int>.buffer_size * 4) = uVar5;
        sVar9 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
        local_80.super_VectorView<unsigned_int>.buffer_size =
             local_80.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar9);
        *(uint32_t *)
         ((char *)local_80.super_VectorView<unsigned_int>.ptr +
         local_80.super_VectorView<unsigned_int>.buffer_size * 4) = TVar7.dst_id;
        sVar9 = local_80.super_VectorView<unsigned_int>.buffer_size + 2;
        local_80.super_VectorView<unsigned_int>.buffer_size =
             local_80.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_80,sVar9);
        *(uint32_t *)
         ((char *)local_80.super_VectorView<unsigned_int>.ptr +
         local_80.super_VectorView<unsigned_int>.buffer_size * 4) = TVar7.src_id;
        local_80.super_VectorView<unsigned_int>.buffer_size =
             local_80.super_VectorView<unsigned_int>.buffer_size + 1;
        this_00->block_temporary_hoisting = true;
        (*(this_00->super_Compiler)._vptr_Compiler[8])(this_00,&local_90);
        this_00->block_temporary_hoisting = false;
        local_80.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_80.super_VectorView<unsigned_int>.ptr !=
            &local_80.stack_storage) {
          free(local_80.super_VectorView<unsigned_int>.ptr);
        }
      }
      instruction = instruction + 1;
      lVar13 = lVar13 + -0xc;
    } while (lVar13 != 0);
  }
  this_00->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;

	if (backend.requires_relaxed_precision_analysis)
	{
		// If PHI variables are consumed in unexpected precision contexts, copy them here.
		for (size_t i = 0, n = block.phi_variables.size(); i < n; i++)
		{
			auto &phi = block.phi_variables[i];

			// Ensure we only copy once. We know a-priori that this array will lay out
			// the same function variables together.
			if (i && block.phi_variables[i - 1].function_variable == phi.function_variable)
				continue;

			auto itr = temporary_to_mirror_precision_alias.find(phi.function_variable);
			if (itr != temporary_to_mirror_precision_alias.end())
			{
				// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
				// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
				EmbeddedInstruction inst;
				inst.op = OpCopyObject;
				inst.length = 3;
				inst.ops.push_back(expression_type_id(itr->first));
				inst.ops.push_back(itr->second);
				inst.ops.push_back(itr->first);
				emit_instruction(inst);
			}
		}
	}

	for (auto &op : block.ops)
	{
		auto temporary_copy = handle_instruction_precision(op);
		emit_instruction(op);
		if (temporary_copy.dst_id)
		{
			// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
			// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
			EmbeddedInstruction inst;
			inst.op = OpCopyObject;
			inst.length = 3;
			inst.ops.push_back(expression_type_id(temporary_copy.src_id));
			inst.ops.push_back(temporary_copy.dst_id);
			inst.ops.push_back(temporary_copy.src_id);

			// Never attempt to hoist mirrored temporaries.
			// They are hoisted in lock-step with their parents.
			block_temporary_hoisting = true;
			emit_instruction(inst);
			block_temporary_hoisting = false;
		}
	}

	current_emitting_block = nullptr;
}